

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::WriteAllBoardsBroadcast(BasePort *this)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  bool local_b9;
  bool local_8d;
  uint local_8c;
  bool ret3;
  uint uStack_88;
  bool ret2;
  quadlet_t ctrl;
  uint numBytes_1;
  bool noneWrittenThisBoard;
  uint board_1;
  uint uStack_74;
  bool ret;
  uint numQuads_1;
  uint numQuads;
  quadlet_t *bcPtr;
  uint local_60;
  uint numBytes;
  uint board;
  int bcBufferOffset;
  quadlet_t *bcBuffer;
  bool noneWritten;
  bool allOK;
  bool rtWrite;
  allocator<char> local_39;
  string local_38 [32];
  BasePort *local_18;
  BasePort *this_local;
  
  local_18 = this;
  uVar3 = (*this->_vptr_BasePort[0x11])();
  if ((uVar3 & 1) == 0) {
    poVar6 = std::operator<<(this->outStr,"BasePort::WriteAllBoardsBroadcast: port not initialized")
    ;
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    (*this->_vptr_BasePort[9])();
    this_local._7_1_ = false;
  }
  else {
    bVar2 = IsBroadcastFirmwareMixValid(this);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_38,"WriteAllBoardsBroadcast",&local_39);
      iVar4 = (*this->_vptr_BasePort[0x1b])(this,local_38,(ulong)(this->autoReScan & 1));
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
        bcBuffer._3_1_ = 1;
        bcBuffer._2_1_ = 1;
        bcBuffer._1_1_ = 1;
        puVar1 = this->WriteBufferBroadcast;
        uVar3 = (*this->_vptr_BasePort[0x17])();
        uVar5 = (*this->_vptr_BasePort[0x14])(this,2);
        _board = puVar1 + (ulong)uVar5 + (ulong)uVar3;
        numBytes = 0;
        for (local_60 = 0; local_60 < this->max_board; local_60 = local_60 + 1) {
          if (this->BoardList[local_60] != (BoardIO *)0x0) {
            bcPtr._4_4_ = (*this->BoardList[local_60]->_vptr_BoardIO[3])();
            _numQuads_1 = _board + ((long)(int)numBytes & 0xfffffffffffffffc);
            if ((this->IsAllBoardsRev4_6_ & 1U) == 0) {
              board_1 = bcPtr._4_4_ >> 2;
              (*this->BoardList[local_60]->_vptr_BoardIO[4])
                        (this->BoardList[local_60],_numQuads_1,0,(ulong)board_1);
            }
            else {
              bcPtr._4_4_ = bcPtr._4_4_ - 4;
              uStack_74 = bcPtr._4_4_ >> 2;
              (*this->BoardList[local_60]->_vptr_BoardIO[4])
                        (this->BoardList[local_60],_numQuads_1,0,(ulong)uStack_74);
            }
            numBytes = numBytes + bcPtr._4_4_;
          }
        }
        iVar4 = (*this->_vptr_BasePort[0x28])(this,_board,(ulong)numBytes);
        noneWrittenThisBoard = (bool)((byte)iVar4 & 1);
        for (numBytes_1 = 0; numBytes_1 < this->max_board; numBytes_1 = numBytes_1 + 1) {
          if (this->BoardList[numBytes_1] != (BoardIO *)0x0) {
            if (this->FirmwareVersion[numBytes_1] < 7) {
              ctrl._3_1_ = 1;
              uStack_88 = (*this->BoardList[numBytes_1]->_vptr_BoardIO[3])();
              (*this->BoardList[numBytes_1]->_vptr_BoardIO[4])
                        (this->BoardList[numBytes_1],&local_8c,(ulong)((uStack_88 >> 2) - 1),1,0);
              local_8d = true;
              if (local_8c != 0) {
                uVar3 = (*this->_vptr_BasePort[0x24])
                                  (this,(ulong)(byte)numBytes_1,0,(ulong)local_8c);
                local_8d = (bool)((byte)uVar3 & 1);
                if ((uVar3 & 1) == 0) {
                  bcBuffer._2_1_ = 0;
                }
                else {
                  bcBuffer._1_1_ = 0;
                  ctrl._3_1_ = 0;
                }
              }
              if ((((ctrl._3_1_ & 1) != 0) &&
                  (uVar3 = (*this->BoardList[numBytes_1]->_vptr_BoardIO[6])(), (uVar3 & 1) == 0)) &&
                 (uVar3 = (*this->_vptr_BasePort[0x25])(this,(ulong)(byte)numBytes_1),
                 (uVar3 & 1) != 0)) {
                bcBuffer._1_1_ = 0;
              }
              local_b9 = false;
              if ((noneWrittenThisBoard & 1U) != 0) {
                local_b9 = local_8d;
              }
              BoardIO::SetWriteValid(this->BoardList[numBytes_1],local_b9);
              (*this->BoardList[numBytes_1]->_vptr_BoardIO[5])();
            }
            else {
              BoardIO::SetWriteValid(this->BoardList[numBytes_1],(bool)(noneWrittenThisBoard & 1));
              (*this->BoardList[numBytes_1]->_vptr_BoardIO[5])();
              if ((noneWrittenThisBoard & 1U) != 0) {
                bcBuffer._1_1_ = 0;
                (*this->BoardList[numBytes_1]->_vptr_BoardIO[7])();
              }
            }
          }
        }
        if ((bcBuffer._1_1_ & 1) != 0) {
          (*this->_vptr_BasePort[9])();
        }
        if ((bcBuffer._3_1_ & 1) == 0) {
          poVar6 = std::operator<<(this->outStr,
                                   "BasePort::WriteAllBoardsBroadcast: rtWrite is false");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        this_local._7_1_ = (bool)(bcBuffer._2_1_ & 1);
      }
      else {
        (*this->_vptr_BasePort[9])();
        this_local._7_1_ = false;
      }
    }
    else {
      poVar6 = std::operator<<(this->outStr,
                               "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      (*this->_vptr_BasePort[9])();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BasePort::WriteAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!CheckFwBusGeneration("WriteAllBoardsBroadcast", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    bool rtWrite = true;   // for debugging

    // sanity check vars
    bool allOK = true;
    bool noneWritten = true;

    // construct broadcast write buffer
    quadlet_t *bcBuffer = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));

    int bcBufferOffset = 0; // the offset for new data to be stored in bcBuffer (bytes)
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            quadlet_t *bcPtr = bcBuffer+bcBufferOffset/sizeof(quadlet_t);
            if (IsAllBoardsRev4_6_) {
                numBytes -= sizeof(quadlet_t);   // for ctrl offset
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            else {
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            // bcBufferOffset equals total numBytes to write, when the loop ends
            bcBufferOffset = bcBufferOffset + numBytes;
        }
    }

    // now broadcast out the huge packet
    bool ret;

    ret = WriteBroadcastOutput(bcBuffer, bcBufferOffset);

    // Send out control quadlet if necessary (firmware prior to Rev 7);
    //    also check for data collection
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            if (FirmwareVersion[board] < 7) {
                bool noneWrittenThisBoard = true;
                unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, (numBytes/sizeof(quadlet_t))-1, 1, false);
                bool ret2 = true;
                if (ctrl) {  // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0x00, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    && !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
            }
        }
    }

    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoardsBroadcast: rtWrite is false" << std::endl;

    // return
    return allOK;
}